

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qarraydataops.h
# Opt level: O1

void __thiscall
QtPrivate::QPodArrayOps<Qt::DayOfWeek>::emplace<Qt::DayOfWeek&>
          (QPodArrayOps<Qt::DayOfWeek> *this,qsizetype i,DayOfWeek *args)

{
  DayOfWeek DVar1;
  Data *pDVar2;
  long lVar3;
  DayOfWeek *pDVar4;
  GrowthPosition where;
  
  pDVar2 = (this->super_QArrayDataPointer<Qt::DayOfWeek>).d;
  if ((pDVar2 == (Data *)0x0) ||
     (1 < (pDVar2->super_QArrayData).ref_._q_value.super___atomic_base<int>._M_i)) {
LAB_00320e94:
    DVar1 = *args;
    where = (GrowthPosition)(i == 0 && (this->super_QArrayDataPointer<Qt::DayOfWeek>).size != 0);
    QArrayDataPointer<Qt::DayOfWeek>::detachAndGrow
              (&this->super_QArrayDataPointer<Qt::DayOfWeek>,where,1,(DayOfWeek **)0x0,
               (QArrayDataPointer<Qt::DayOfWeek> *)0x0);
    pDVar4 = createHole(this,where,i,1);
    *pDVar4 = DVar1;
  }
  else {
    lVar3 = (this->super_QArrayDataPointer<Qt::DayOfWeek>).size;
    if ((lVar3 == i && pDVar2 != (Data *)0x0) &&
       ((pDVar2->super_QArrayData).alloc !=
        ((long)((long)(this->super_QArrayDataPointer<Qt::DayOfWeek>).ptr -
               ((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)) >> 2) +
        lVar3)) {
      (this->super_QArrayDataPointer<Qt::DayOfWeek>).ptr[lVar3] = *args;
    }
    else {
      if (((i != 0) || (pDVar2 == (Data *)0x0)) ||
         ((DayOfWeek *)((ulong)((long)&pDVar2[1].super_QArrayData.alloc + 7U) & 0xfffffffffffffff0)
          == (this->super_QArrayDataPointer<Qt::DayOfWeek>).ptr)) goto LAB_00320e94;
      pDVar4 = (this->super_QArrayDataPointer<Qt::DayOfWeek>).ptr;
      pDVar4[-1] = *args;
      (this->super_QArrayDataPointer<Qt::DayOfWeek>).ptr = pDVar4 + -1;
    }
    (this->super_QArrayDataPointer<Qt::DayOfWeek>).size = lVar3 + 1;
  }
  return;
}

Assistant:

void emplace(qsizetype i, Args &&... args)
    {
        bool detach = this->needsDetach();
        if (!detach) {
            if (i == this->size && this->freeSpaceAtEnd()) {
                new (this->end()) T(std::forward<Args>(args)...);
                ++this->size;
                return;
            }
            if (i == 0 && this->freeSpaceAtBegin()) {
                new (this->begin() - 1) T(std::forward<Args>(args)...);
                --this->ptr;
                ++this->size;
                return;
            }
        }
        T tmp(std::forward<Args>(args)...);
        typename QArrayData::GrowthPosition pos = QArrayData::GrowsAtEnd;
        if (this->size != 0 && i == 0)
            pos = QArrayData::GrowsAtBeginning;

        this->detachAndGrow(pos, 1, nullptr, nullptr);

        T *where = createHole(pos, i, 1);
        new (where) T(std::move(tmp));
    }